

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O2

void __thiscall
Kernel::Signature::Symbol::addToDistinctGroup(Symbol *this,uint group,uint this_number)

{
  long lVar1;
  DistinctGroupMembers members;
  SmartPtr<Lib::Stack<unsigned_int>_> local_28;
  
  Lib::List<unsigned_int>::push(group,&this->_distinctGroups);
  lVar1 = DAT_00a14190;
  *(undefined1 *)(DAT_00a14190 + 0x1c8) = 1;
  Lib::SmartPtr<Lib::Stack<unsigned_int>_>::SmartPtr
            (&local_28,
             (SmartPtr<Lib::Stack<unsigned_int>_> *)((ulong)group * 0x10 + *(long *)(lVar1 + 0x1b0))
            );
  Lib::Stack<unsigned_int>::push(local_28._obj,this_number);
  Lib::SmartPtr<Lib::Stack<unsigned_int>_>::~SmartPtr(&local_28);
  return;
}

Assistant:

void Signature::Symbol::addToDistinctGroup(unsigned group,unsigned this_number)
{
  ASS_EQ(arity(), 0);
  ASS(!List<unsigned>::member(group, _distinctGroups))

  List<unsigned>::push(group, _distinctGroups);
  env.signature->_distinctGroupsAddedTo=true;

  Signature::DistinctGroupMembers members = env.signature->_distinctGroupMembers[group];
  members->push(this_number);
}